

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O3

ze_result_t loader::zeEventDestroy(ze_event_handle_t hEvent)

{
  _ze_event_handle_t *_key;
  ze_result_t zVar1;
  
  if (*(code **)(*(long *)(hEvent + 8) + 0x4a0) == (code *)0x0) {
    zVar1 = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    _key = *(_ze_event_handle_t **)hEvent;
    zVar1 = (**(code **)(*(long *)(hEvent + 8) + 0x4a0))(_key);
    if (zVar1 == ZE_RESULT_SUCCESS) {
      singleton_factory_t<object_t<_ze_event_handle_t_*>,__ze_event_handle_t_*>::release
                ((singleton_factory_t<object_t<_ze_event_handle_t_*>,__ze_event_handle_t_*> *)
                 (context + 0x1e0),_key);
      zVar1 = ZE_RESULT_SUCCESS;
    }
  }
  return zVar1;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeEventDestroy(
        ze_event_handle_t hEvent                        ///< [in][release] handle of event object to destroy
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_event_object_t*>( hEvent )->dditable;
        auto pfnDestroy = dditable->ze.Event.pfnDestroy;
        if( nullptr == pfnDestroy )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hEvent = reinterpret_cast<ze_event_object_t*>( hEvent )->handle;

        // forward to device-driver
        result = pfnDestroy( hEvent );

        if( ZE_RESULT_SUCCESS != result )
            return result;

        // release loader handle
        context->ze_event_factory.release( hEvent );

        return result;
    }